

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
               (void)

{
  Field_operators **this;
  undefined8 uVar1;
  bool bVar2;
  reference this_00;
  reference witness;
  pointer __args;
  pointer pPVar3;
  pointer pPVar4;
  reference pPVar5;
  int *__args_00;
  uint *__args_1;
  uint *__args_2;
  type_conflict1 *__args_1_00;
  type_conflict1 *__args_2_00;
  type_conflict *__args_01;
  lazy_ostream *plVar6;
  reference ptVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar11;
  basic_cstring<const_char> local_a90;
  basic_cstring<const_char> local_a80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a70;
  assertion_result local_a50;
  basic_cstring<const_char> local_a38;
  basic_cstring<const_char> local_a28;
  basic_cstring<const_char> local_a18;
  basic_cstring<const_char> local_a08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9f8;
  assertion_result local_9d8;
  basic_cstring<const_char> local_9c0;
  basic_cstring<const_char> local_9b0;
  basic_cstring<const_char> local_9a0;
  basic_cstring<const_char> local_990;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_980;
  _Self local_960;
  assertion_result local_958;
  basic_cstring<const_char> local_940;
  basic_cstring<const_char> local_930;
  undefined4 local_91c;
  basic_cstring<const_char> local_918;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_908;
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  undefined4 local_8bc;
  basic_cstring<const_char> local_8b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_8a8;
  basic_cstring<const_char> local_880;
  basic_cstring<const_char> local_870;
  undefined4 local_85c;
  basic_cstring<const_char> local_858;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_848;
  basic_cstring<const_char> local_820;
  basic_cstring<const_char> local_810;
  undefined4 local_7fc;
  basic_cstring<const_char> local_7f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_7e8;
  basic_cstring<const_char> local_7c0;
  basic_cstring<const_char> local_7b0;
  undefined4 local_79c;
  basic_cstring<const_char> local_798;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_788;
  basic_cstring<const_char> local_760;
  basic_cstring<const_char> local_750;
  undefined4 local_73c;
  basic_cstring<const_char> local_738;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_728;
  basic_cstring<const_char> local_700;
  basic_cstring<const_char> local_6f0;
  undefined4 local_6dc;
  basic_cstring<const_char> local_6d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6c8;
  basic_cstring<const_char> local_6a0;
  basic_cstring<const_char> local_690;
  undefined4 local_67c;
  basic_cstring<const_char> local_678;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_668;
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  undefined4 local_61c;
  basic_cstring<const_char> local_618;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_608;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  undefined4 local_5bc;
  basic_cstring<const_char> local_5b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5a8;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  undefined4 local_55c;
  basic_cstring<const_char> local_558;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_548;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  undefined4 local_4fc;
  basic_cstring<const_char> local_4f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4e8;
  basic_cstring<const_char> local_4c0;
  basic_cstring<const_char> local_4b0;
  undefined4 local_49c;
  basic_cstring<const_char> local_498;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_488;
  basic_cstring<const_char> local_460;
  basic_cstring<const_char> local_450;
  undefined4 local_43c;
  basic_cstring<const_char> local_438;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_428;
  basic_cstring<const_char> local_400;
  basic_cstring<const_char> local_3f0;
  undefined4 local_3dc;
  basic_cstring<const_char> local_3d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3c8;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_380;
  iterator it;
  type *z;
  type *y;
  type *x;
  uint local_348;
  _Base_ptr local_340;
  undefined1 local_338;
  _Base_ptr local_330;
  undefined1 local_328;
  __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
  local_320;
  __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
  local_318;
  const_iterator it_1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  undefined1 local_228 [4];
  uint i;
  undefined1 local_210 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  Barcode *barcode;
  undefined1 local_1e0 [8];
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
              *)local_1e0,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,5);
  rows.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_current_barcode
                          ((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_1e0);
  this = &m.matrix_.operators_;
  this_00 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)this,5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(this_00);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)this,(Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                      *)local_1e0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_210);
  build_longer_reduced_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_210,
              (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_228);
  __range2._4_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_210);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&r), bVar2) {
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    get_ordered_row<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
              ((column_content<typename_Matrix<RU_rep_options_with_row_access<true,_(Column_types)7,_false,_true,_true,_true,_false,_true>_>::Column>
                *)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                *)local_1e0,__range2._4_4_);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
                        *)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &bars1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  local_318._M_current =
       (Persistence_interval<int,_unsigned_int> *)
       std::
       vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::begin((vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)rows.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_320._M_current =
         (Persistence_interval<int,_unsigned_int> *)
         std::
         vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end((vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)rows.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=(&local_318,&local_320);
    if (!bVar2) break;
    __args = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator->(&local_318);
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator->(&local_318);
    pPVar4 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator->(&local_318);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,&__args->dim,
                        &pPVar3->birth,&pPVar4->death);
    local_330 = (_Base_ptr)pVar11.first._M_node;
    local_328 = pVar11.second;
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_318);
    __args_00 = std::get<2ul,int,unsigned_int>(pPVar5);
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_318);
    __args_1 = std::get<0ul,int,unsigned_int>(pPVar5);
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_318);
    __args_2 = std::get<1ul,int,unsigned_int>(pPVar5);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count,__args_00,
                        __args_1,__args_2);
    local_340 = (_Base_ptr)pVar11.first._M_node;
    local_338 = pVar11.second;
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_318);
    local_348 = pPVar5->death;
    x = *(type **)pPVar5;
    __args_1_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<0ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_2_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<1ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_01 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<2ul>
                          ((Persistence_interval<int,unsigned_int> *)&x);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int&,unsigned_int&,unsigned_int&>
                       ((set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&it_1,__args_01,__args_1_00,__args_2_00);
    it._M_node = (_Base_ptr)pVar11.first._M_node;
    __gnu_cxx::
    __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
    ::operator++(&local_318);
  }
  local_380._M_node =
       (_Base_ptr)
       std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
       begin((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_390,0x574,&local_3a0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3c8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_3dc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_3c8,&local_3d8,0x574,1,2,p_Var8,"std::get<0>(*it)",&local_3dc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_400);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3f0,0x575,&local_400);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_428,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_43c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_428,&local_438,0x575,1,2,p_Var9,"std::get<1>(*it)",&local_43c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_428);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_460);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x577,&local_460);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_488,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_49c = 0xffffffff;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_488,&local_498,0x577,1,2,p_Var10,"std::get<2>(*it)",&local_49c,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_488);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_380);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b0,0x579,&local_4c0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4e8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_4fc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_4e8,&local_4f8,0x579,1,2,p_Var8,"std::get<0>(*it)",&local_4fc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_520);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_510,0x57a,&local_520);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_548,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_55c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_548,&local_558,0x57a,1,2,p_Var9,"std::get<1>(*it)",&local_55c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_580);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_570,0x57b,&local_580);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5a8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_5bc = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_5a8,&local_5b8,0x57b,1,2,p_Var10,"std::get<2>(*it)",&local_5bc,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_380);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5d0,0x57d,&local_5e0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_608,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_618,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_61c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_608,&local_618,0x57d,1,2,p_Var8,"std::get<0>(*it)",&local_61c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_608);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_630,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_640);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_630,0x57e,&local_640);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_668,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_678,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_67c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_668,&local_678,0x57e,1,2,p_Var9,"std::get<1>(*it)",&local_67c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_668);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_690,0x57f,&local_6a0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6c8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_6dc = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_6c8,&local_6d8,0x57f,1,2,p_Var10,"std::get<2>(*it)",&local_6dc,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_380);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_700);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6f0,0x581,&local_700);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_728,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_73c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_728,&local_738,0x581,1,2,p_Var8,"std::get<0>(*it)",&local_73c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_728);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_750,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_760);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_750,0x582,&local_760);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_788,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_798,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_79c = 7;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_788,&local_798,0x582,1,2,p_Var9,"std::get<1>(*it)",&local_79c,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_788);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7b0,0x583,&local_7c0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_7e8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_7fc = 8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_7e8,&local_7f8,0x583,1,2,p_Var10,"std::get<2>(*it)",&local_7fc,"8");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_7e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_380);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_810,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_820);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_810,0x585,&local_820);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_848,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_85c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_848,&local_858,0x585,1,2,p_Var8,"std::get<0>(*it)",&local_85c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_848);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_870,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_880);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_870,0x586,&local_880);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_8a8,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_8bc = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_8a8,&local_8b8,0x586,1,2,p_Var9,"std::get<1>(*it)",&local_8bc,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_8a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8d0,0x587,&local_8e0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_908,plVar6,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_918,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_380);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_91c = 6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_908,&local_918,0x587,1,2,p_Var10,"std::get<2>(*it)",&local_91c,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_908);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_380);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_930,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_930,0x589,&local_940);
    local_960._M_node =
         (_Base_ptr)
         std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
         end((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator==(&local_380,&local_960);
    boost::test_tools::assertion_result::assertion_result(&local_958,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_990,"it == bars1.end()",0x11);
    boost::unit_test::operator<<(&local_980,plVar6,&local_990);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_958,&local_980,&local_9a0,0x589,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_980);
    boost::test_tools::assertion_result::~assertion_result(&local_958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9b0,0x58b,&local_9c0);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::test_tools::assertion_result::assertion_result(&local_9d8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a08,"bars1 == bars2",0xe);
    boost::unit_test::operator<<(&local_9f8,plVar6,&local_a08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_9d8,&local_9f8,&local_a18,0x58b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9f8);
    boost::test_tools::assertion_result::~assertion_result(&local_9d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a28,0x58c,&local_a38);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&it_1);
    boost::test_tools::assertion_result::assertion_result(&local_a50,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a80,"bars1 == bars3",0xe);
    boost::unit_test::operator<<(&local_a70,plVar6,&local_a80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a50,&local_a70,&local_a90,0x58c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a70);
    boost::test_tools::assertion_result::~assertion_result(&local_a50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  ::~Matrix((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
             *)local_1e0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}